

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBlockMemoryAllocator.cpp
# Opt level: O2

void __thiscall
Diligent::FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(FixedBlockMemoryAllocator *this)

{
  pointer pvVar1;
  iterator iVar2;
  string msg;
  ulong local_58;
  string local_50;
  
  local_58 = 0;
  while( true ) {
    pvVar1 = (this->m_PagePool).
             super__Vector_base<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_PagePool).
                      super__Vector_base<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 5) <= local_58)
    break;
    if (pvVar1[local_58].m_NumFreeBlocks < pvVar1[local_58].m_NumInitializedBlocks) {
      FormatString<char[54]>
                (&local_50,(char (*) [54])"Memory leak detected: memory page has allocated block");
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"~FixedBlockMemoryAllocator",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
                 ,0xc4);
      std::__cxx11::string::~string((string *)&local_50);
    }
    iVar2 = std::
            _Hashtable<unsigned_long,_unsigned_long,_Diligent::STDAllocator<unsigned_long,_Diligent::IMemoryAllocator>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&(this->m_AvailablePages)._M_h,&local_58);
    if (iVar2.super__Node_iterator_base<unsigned_long,_false>._M_cur == (__node_type *)0x0) {
      FormatString<char[46]>
                (&local_50,(char (*) [46])"Memory page is not in the available page pool");
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"~FixedBlockMemoryAllocator",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
                 ,0xc5);
      std::__cxx11::string::~string((string *)&local_50);
    }
    local_58 = local_58 + 1;
  }
  std::
  _Hashtable<void_*,_std::pair<void_*const,_unsigned_long>,_Diligent::STDAllocator<std::pair<void_*const,_unsigned_long>,_Diligent::IMemoryAllocator>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->m_AddrToPageId)._M_h);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_Diligent::STDAllocator<unsigned_long,_Diligent::IMemoryAllocator>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->m_AvailablePages)._M_h);
  std::
  vector<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
  ::~vector(&this->m_PagePool);
  return;
}

Assistant:

FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator()
{
#ifdef DILIGENT_DEBUG
    for (size_t p = 0; p < m_PagePool.size(); ++p)
    {
        VERIFY(!m_PagePool[p].HasAllocations(), "Memory leak detected: memory page has allocated block");
        VERIFY(m_AvailablePages.find(p) != m_AvailablePages.end(), "Memory page is not in the available page pool");
    }
#endif
}